

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool>
               (string_t *ldata,string_t *rdata,int *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined8 uVar1;
  string_t right;
  string_t right_00;
  string_t left;
  bool bVar2;
  int iVar3;
  idx_t iVar4;
  undefined8 *puVar5;
  idx_t iVar6;
  anon_union_16_2_67f50693_for_value *paVar7;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  string_t rentry_1;
  string_t lentry_1;
  idx_t i_1;
  string_t rentry;
  string_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  ulong in_stack_ffffffffffffff08;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff10;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff18;
  long lVar8;
  ValidityMask *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff60;
  ulong local_98;
  ulong local_40;
  
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar2) && (bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar2))
  {
    for (local_98 = 0; local_98 < in_R9; local_98 = local_98 + 1) {
      lVar8 = in_RDI;
      iVar4 = SelectionVector::get_index(in_RCX,local_98);
      puVar5 = (undefined8 *)(lVar8 + iVar4 * 0x10);
      uVar1 = *puVar5;
      iVar4 = puVar5[1];
      iVar6 = SelectionVector::get_index(in_R8,local_98);
      paVar7 = (anon_union_16_2_67f50693_for_value *)(in_RSI + iVar6 * 0x10);
      right_00.value.pointer.ptr = (char *)iVar4;
      right_00.value._0_8_ = uVar1;
      iVar3 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::BitPositionOperator,duckdb::string_t,duckdb::string_t,int>
                        (SUB81((ulong)(paVar7->pointer).ptr >> 0x38,0),(string_t)paVar7->pointer,
                         right_00,*(ValidityMask **)paVar7,iVar4);
      *(int *)(in_RDX + local_98 * 4) = iVar3;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff18,(idx_t)in_stack_ffffffffffffff10);
      if ((bVar2) &&
         (bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff18,(idx_t)in_stack_ffffffffffffff10), bVar2)) {
        left.value.pointer.ptr = (char *)in_stack_ffffffffffffff50;
        left.value._0_8_ = in_stack_ffffffffffffff48;
        right.value.pointer.ptr = (char *)in_stack_ffffffffffffff40;
        right.value._0_8_ = in_stack_ffffffffffffff38;
        in_stack_ffffffffffffff08 = local_40;
        iVar3 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::BitPositionOperator,duckdb::string_t,duckdb::string_t,int>
                          (SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0),left,right,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff60);
        *(int *)(in_RDX + local_40 * 4) = iVar3;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}